

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::UpdateAttribute
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attr,BOOL value,BOOL *isNumericPropertyId)

{
  byte bVar1;
  JavascriptLibrary *pJVar2;
  bool bVar3;
  byte bVar4;
  BOOL BVar5;
  JavascriptArray *this_00;
  uint32 local_64;
  IndexPropertyDescriptor *local_60;
  IndexPropertyDescriptor *descriptor;
  int i;
  IndexPropertyDescriptorMap *local_40;
  uint32 local_34 [2];
  uint32 index;
  
  BVar5 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_34);
  *isNumericPropertyId = BVar5;
  if (BVar5 == 0) {
LAB_00db802a:
    BVar5 = 0;
  }
  else {
    local_64 = local_34[0];
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_64,&local_60,
                       (int *)&descriptor);
    if (bVar3) {
      bVar4 = local_60->Attributes;
      if ((bVar4 & 8) != 0) goto LAB_00db802a;
      if (value != 0) {
        local_60->Attributes = bVar4 | attr;
        return 1;
      }
      bVar4 = bVar4 & ~attr;
      local_60->Attributes = bVar4;
    }
    else {
      this_00 = &VarTo<Js::ES5Array,Js::DynamicObject>(instance)->super_JavascriptArray;
      BVar5 = JavascriptArray::DirectGetItemAt<void*>(this_00,local_34[0],&descriptor);
      if (BVar5 == 0) goto LAB_00db802a;
      bVar1 = this->dataItemAttributes;
      bVar4 = bVar1 | attr;
      if (value == 0) {
        bVar4 = ~attr & bVar1;
      }
      if (bVar4 == bVar1) {
        return 1;
      }
      local_40 = (this->indexPropertyMap).ptr;
      IndexPropertyDescriptor::IndexPropertyDescriptor
                ((IndexPropertyDescriptor *)&descriptor,bVar4,(Var)0x0,(Var)0x0);
      IndexPropertyDescriptorMap::Add(local_40,local_34[0],(IndexPropertyDescriptor *)&descriptor);
    }
    BVar5 = 1;
    if ((bVar4 & 4) == 0) {
      BVar5 = 1;
      DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this,false);
      if (((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) != 0)
      {
        pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
        Memory::Recycler::WBSetBit((char *)&descriptor);
        descriptor = (IndexPropertyDescriptor *)&pJVar2->typesWithOnlyWritablePropertyProtoChain;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)descriptor);
      }
    }
  }
  return BVar5;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::UpdateAttribute(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attr, BOOL value, BOOL& isNumericPropertyId)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        isNumericPropertyId = scriptContext->IsNumericPropertyId(propertyId, &index);
        if (isNumericPropertyId)
        {
            IndexPropertyDescriptor* descriptor;
            if (indexPropertyMap->TryGetReference(index, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    return false;
                }

                if (value)
                {
                    descriptor->Attributes |= attr;
                }
                else
                {
                    descriptor->Attributes &= (~attr);
                    if (!(descriptor->Attributes & PropertyWritable))
                    {
                        this->ClearHasOnlyWritableDataProperties();
                        if(this->GetFlags() & this->IsPrototypeFlag)
                        {
                            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                        }
                    }
                }
            }
            else
            {
                if (!HasDataItem(VarTo<ES5Array>(instance), index))
                {
                    return false;
                }

                PropertyAttributes newAttr = GetDataItemAttributes();
                if (value)
                {
                    newAttr |= attr;
                }
                else
                {
                    newAttr &= (~attr);
                }

                if (newAttr != GetDataItemAttributes())
                {
                    indexPropertyMap->Add(index, IndexPropertyDescriptor(newAttr));
                    if (!(newAttr & PropertyWritable))
                    {
                        this->ClearHasOnlyWritableDataProperties();
                        if(this->GetFlags() & this->IsPrototypeFlag)
                        {
                            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                        }
                    }
                }
            }

            return true;
        }

        return false;
    }